

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O0

float vkt::tessellation::getClampedTessLevel(SpacingMode mode,float tessLevel)

{
  float tessLevel_local;
  SpacingMode mode_local;
  
  if (mode == SPACINGMODE_EQUAL) {
    tessLevel_local = de::max<float>(1.0,tessLevel);
  }
  else if (mode == SPACINGMODE_FRACTIONAL_ODD) {
    tessLevel_local = de::max<float>(1.0,tessLevel);
  }
  else if (mode == SPACINGMODE_FRACTIONAL_EVEN) {
    tessLevel_local = de::max<float>(2.0,tessLevel);
  }
  else {
    tessLevel_local = 0.0;
  }
  return tessLevel_local;
}

Assistant:

float getClampedTessLevel (const SpacingMode mode, const float tessLevel)
{
	switch (mode)
	{
		case SPACINGMODE_EQUAL:				return de::max(1.0f, tessLevel);
		case SPACINGMODE_FRACTIONAL_ODD:	return de::max(1.0f, tessLevel);
		case SPACINGMODE_FRACTIONAL_EVEN:	return de::max(2.0f, tessLevel);
		default:
			DE_ASSERT(false);
			return 0.0f;
	}
}